

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O3

void __thiscall lf::base::AutoTimer::Report(AutoTimer *this)

{
  variant<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
  *__v;
  logger *this_00;
  variant_alternative_t<1UL,_variant<basic_ostream<char>_*,_pair<shared_ptr<logger>,_level_enum>_>_>
  *pvVar1;
  ostream *poVar2;
  string_view format;
  string string;
  string local_48;
  char local_28 [24];
  
  format._M_str = (this->format_)._M_dataplus._M_p;
  format._M_len = (this->format_)._M_string_length;
  Timer::Format_abi_cxx11_(&local_48,&this->timer_,format);
  __v = &this->output_;
  if (*(__index_type *)
       ((long)&(this->output_).
               super__Variant_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
               .
               super__Move_assign_alias<std::basic_ostream<char>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
               .
               super__Copy_assign_alias<std::basic_ostream<char>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
               .
               super__Move_ctor_alias<std::basic_ostream<char>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
               .
               super__Copy_ctor_alias<std::basic_ostream<char>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
               .
               super__Variant_storage_alias<std::basic_ostream<char>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
       + 0x18) == '\0') {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (*(ostream **)
                         &(__v->
                          super__Variant_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
                          ).
                          super__Move_assign_alias<std::basic_ostream<char>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
                          .
                          super__Copy_assign_alias<std::basic_ostream<char>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
                          .
                          super__Move_ctor_alias<std::basic_ostream<char>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
                          .
                          super__Copy_ctor_alias<std::basic_ostream<char>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
                          .
                          super__Variant_storage_alias<std::basic_ostream<char>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
                          ._M_u,local_48._M_dataplus._M_p,local_48._M_string_length);
    local_28[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_28,1);
  }
  else {
    pvVar1 = std::
             get<1ul,std::ostream*,std::pair<std::shared_ptr<spdlog::logger>,spdlog::level::level_enum>>
                       (__v);
    this_00 = (pvVar1->first).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::get<1ul,std::ostream*,std::pair<std::shared_ptr<spdlog::logger>,spdlog::level::level_enum>>
              (__v);
    local_28[0] = '\0';
    local_28[1] = '\0';
    local_28[2] = '\0';
    local_28[3] = '\0';
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_28[8] = '\0';
    local_28[9] = '\0';
    local_28[10] = '\0';
    local_28[0xb] = '\0';
    local_28[0xc] = '\0';
    local_28[0xd] = '\0';
    local_28[0xe] = '\0';
    local_28[0xf] = '\0';
    local_28[0x10] = '\0';
    local_28[0x11] = '\0';
    local_28[0x12] = '\0';
    local_28[0x13] = '\0';
    local_28[0x14] = '\0';
    local_28[0x15] = '\0';
    local_28[0x16] = '\0';
    local_28[0x17] = '\0';
    spdlog::logger::log(this_00,0.0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AutoTimer::Report() {
  auto string = timer_.Format(format_);
  if (auto* ostream = std::get_if<std::ostream*>(&output_)) {
    (**ostream) << string << '\n';
  } else {
    std::get<1>(output_).first->log(std::get<1>(output_).second, string);
  }
}